

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctstr_iincl(char *str,char *check_incl)

{
  char *__ptr;
  char *__ptr_00;
  uint uVar1;
  char *__needle;
  char *pcVar2;
  
  __ptr = fctstr_clone_lower(str);
  __ptr_00 = fctstr_clone_lower(check_incl);
  pcVar2 = __ptr;
  if (__ptr == (char *)0x0) {
    pcVar2 = "";
  }
  __needle = __ptr_00;
  if (__ptr_00 == (char *)0x0) {
    __needle = "";
  }
  if (pcVar2 == __needle) {
    uVar1 = 1;
  }
  else {
    pcVar2 = strstr(pcVar2,__needle);
    uVar1 = (uint)(pcVar2 != (char *)0x0);
  }
  free(__ptr);
  free(__ptr_00);
  return uVar1;
}

Assistant:

static int
fctstr_iincl(char const *str, char const *check_incl)
{
    /* Going to do this with a memory allocation to save coding
    time. In the future this can be rewritten. Both clone_lower
    and _incl are NULL tolerant. */
    char *lstr = fctstr_clone_lower(str);
    char *lcheck_incl = fctstr_clone_lower(check_incl);
    int found = fctstr_incl(lstr, lcheck_incl);
    free(lstr);
    free(lcheck_incl);
    return found;
}